

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IfGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MemberSyntax&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,ExpressionSyntax *args_3,Token *args_4,MemberSyntax *args_5,
          ElseClauseSyntax **args_6)

{
  Token keyword;
  Token openParen;
  Token closeParen;
  IfGenerateSyntax *this_00;
  Token *args_local_4;
  ExpressionSyntax *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (IfGenerateSyntax *)allocate(this,0x88,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::IfGenerateSyntax::IfGenerateSyntax
            (this_00,args,keyword,openParen,args_3,closeParen,args_5,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }